

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O1

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<true>,_true,_4>::
apply_samples<(Outputs::Speaker::Action)0>
          (SampleSource<GI::AY38910::AY38910<true>,_true,_4> *this,size_t number_of_samples,
          type *target)

{
  AY38910SampleSource<true> *this_00;
  int iVar1;
  long lVar2;
  type *ptVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  type level;
  type local_4c;
  undefined4 local_48;
  undefined4 local_44;
  
  this_00 = (AY38910SampleSource<true> *)(this + -0x454);
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  uVar4 = 0;
  if ((number_of_samples != 0) && (this->master_divider_ != 4)) {
    uVar4 = 0;
    do {
      target[uVar4] = local_4c;
      uVar4 = uVar4 + 1;
      iVar1 = this->master_divider_ + 1;
      this->master_divider_ = iVar1;
      if (number_of_samples <= uVar4) break;
    } while (iVar1 != 4);
  }
  GI::AY38910::AY38910SampleSource<true>::advance(this_00);
  uVar6 = number_of_samples - uVar4 >> 2;
  if ((int)uVar6 != 0) {
    ptVar3 = target + uVar4;
    do {
      uVar4 = uVar4 + 4;
      GI::AY38910::AY38910SampleSource<true>::level(this_00);
      lVar2 = 0;
      do {
        *(undefined4 *)((long)&ptVar3->left + lVar2) = local_44;
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0x10);
      GI::AY38910::AY38910SampleSource<true>::advance(this_00);
      ptVar3 = ptVar3 + 4;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  this->master_divider_ = (int)number_of_samples - (int)uVar4;
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  if (number_of_samples != uVar4) {
    lVar2 = uVar4 << 2;
    do {
      *(undefined4 *)((long)&target->left + lVar2) = local_48;
      lVar2 = lVar2 + 4;
    } while (number_of_samples << 2 != lVar2);
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}